

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O0

int64_t file_seek(archive_conflict *a,void *client_data,int64_t request,wchar_t whence)

{
  int *piVar1;
  int64_t r;
  read_file_data *mine;
  wchar_t whence_local;
  int64_t request_local;
  void *client_data_local;
  archive_conflict *a_local;
  
  a_local = (archive_conflict *)lseek(*client_data,request,whence);
  if ((long)a_local < 0) {
    if (*(int *)((long)client_data + 0x20) == 0) {
      piVar1 = __errno_location();
      archive_set_error((archive *)a,*piVar1,"Error seeking in stdin");
    }
    else if (*(int *)((long)client_data + 0x20) == 1) {
      piVar1 = __errno_location();
      archive_set_error((archive *)a,*piVar1,"Error seeking in \'%s\'",(long)client_data + 0x24);
    }
    else {
      piVar1 = __errno_location();
      archive_set_error((archive *)a,*piVar1,"Error seeking in \'%ls\'",(long)client_data + 0x24);
    }
    a_local = (archive_conflict *)0xffffffffffffffe2;
  }
  return (int64_t)a_local;
}

Assistant:

static int64_t
file_seek(struct archive *a, void *client_data, int64_t request, int whence)
{
	struct read_file_data *mine = (struct read_file_data *)client_data;
	int64_t r;

	/* We use off_t here because lseek() is declared that way. */
	/* See above for notes about when off_t is less than 64 bits. */
	r = lseek(mine->fd, request, whence);
	if (r >= 0)
		return r;

	/* If the input is corrupted or truncated, fail. */
	if (mine->filename_type == FNT_STDIN)
		archive_set_error(a, errno, "Error seeking in stdin");
	else if (mine->filename_type == FNT_MBS)
		archive_set_error(a, errno, "Error seeking in '%s'",
		    mine->filename.m);
	else
		archive_set_error(a, errno, "Error seeking in '%ls'",
		    mine->filename.w);
	return (ARCHIVE_FATAL);
}